

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O3

size_t __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::add_node(rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
           *this,node_type *n)

{
  node_type *pnVar1;
  stored_size_type sVar2;
  ulong uVar3;
  pointer prVar4;
  size_t sVar5;
  double dVar6;
  undefined7 uVar7;
  ulong uVar8;
  
  sVar2 = (this->overwritable_nodes_).
          super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.
          m_holder.m_size;
  if (sVar2 == 0) {
    uVar8 = (this->tree_).m_holder.m_size;
    boost::container::
    vector<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>,std::allocator<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>>,void>
    ::priv_push_back<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>const&>
              ((vector<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>,std::allocator<perior::detail::rtree_node<perior::point<double,2ul>,2ul,6ul>>,void>
                *)&this->tree_,n);
  }
  else {
    uVar3 = (this->tree_).m_holder.m_size;
    uVar8 = (this->overwritable_nodes_).
            super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.
            m_holder.m_start[sVar2 - 1];
    (this->overwritable_nodes_).
    super_small_vector_base<unsigned_long,_std::allocator<unsigned_long>,_void>.super_type.m_holder.
    m_size = sVar2 - 1;
    if (uVar3 <= uVar8) {
      boost::container::throw_out_of_range("vector::at out of range");
    }
    prVar4 = (this->tree_).m_holder.m_start;
    pnVar1 = prVar4 + uVar8;
    uVar7 = *(undefined7 *)&n->field_0x1;
    sVar5 = n->parent;
    prVar4 = prVar4 + uVar8;
    prVar4->is_leaf = n->is_leaf;
    *(undefined7 *)&prVar4->field_0x1 = uVar7;
    prVar4->parent = sVar5;
    if (pnVar1 != n) {
      rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
      ::add_node();
    }
    dVar6 = (n->box).center.values_.elems[1];
    (pnVar1->box).center.values_.elems[0] = (n->box).center.values_.elems[0];
    (pnVar1->box).center.values_.elems[1] = dVar6;
    dVar6 = (n->box).radius.values_.elems[1];
    (pnVar1->box).radius.values_.elems[0] = (n->box).radius.values_.elems[0];
    (pnVar1->box).radius.values_.elems[1] = dVar6;
  }
  return uVar8;
}

Assistant:

std::size_t add_node(const node_type& n)
    {
        if(overwritable_nodes_.empty())
        {
            const std::size_t idx = tree_.size();
            tree_.push_back(n);
            return idx;
        }
        else
        {
            const std::size_t idx = overwritable_nodes_.back();
            overwritable_nodes_.pop_back();
            tree_.at(idx) = n;
            return idx;
        }
    }